

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O1

void __thiscall
TransitionObservationIndependentMADPDiscrete::AddState
          (TransitionObservationIndependentMADPDiscrete *this,Index agentI,string *name)

{
  pointer ppMVar1;
  EInvalidIndex *this_00;
  
  ppMVar1 = (this->_m_individualMADPDs).
            super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)agentI <
      (ulong)((long)(this->_m_individualMADPDs).
                    super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar1 >> 3)) {
    MADPComponentDiscreteStates::AddState(&ppMVar1[agentI]->_m_S,name);
    return;
  }
  this_00 = (EInvalidIndex *)__cxa_allocate_exception(0x28);
  EInvalidIndex::EInvalidIndex
            (this_00,
             "TransitionObservationIndependentMADPDiscrete::AddState - agentI out of bounds...");
  __cxa_throw(this_00,&EInvalidIndex::typeinfo,E::~E);
}

Assistant:

void TransitionObservationIndependentMADPDiscrete::AddState(Index agentI, const string &name)
{
    if(agentI >= _m_individualMADPDs.size())
        throw EInvalidIndex("TransitionObservationIndependentMADPDiscrete::AddState - agentI out of bounds...");
    _m_individualMADPDs[agentI]->AddState(name);    
}